

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O3

CURLcode Curl_conn_flush(Curl_easy *data,int sockindex)

{
  Curl_cfilter *pCVar1;
  Curl_cft_cntrl *pCVar2;
  CURLcode CVar3;
  
  pCVar1 = data->conn->cfilter[sockindex];
  while( true ) {
    if (pCVar1 == (Curl_cfilter *)0x0) {
      return CURLE_OK;
    }
    pCVar2 = pCVar1->cft->cntrl;
    if ((pCVar2 != Curl_cf_def_cntrl) &&
       (CVar3 = (*pCVar2)(pCVar1,data,0x102,0,(void *)0x0), CVar3 != CURLE_OK)) break;
    pCVar1 = pCVar1->next;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_conn_flush(struct Curl_easy *data, int sockindex)
{
  return Curl_conn_cf_cntrl(data->conn->cfilter[sockindex], data, FALSE,
                            CF_CTRL_FLUSH, 0, NULL);
}